

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

SharedDispatcher __thiscall
AmsConnection::DispatcherListAdd(AmsConnection *this,VirtualConnection *connection)

{
  uint16_t *__mutex;
  pair<unsigned_short,_AmsAddr> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>,_bool>
  pVar1;
  SharedDispatcher SVar2;
  SharedDispatcher dispatcher;
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  code *local_48;
  char local_40 [8];
  unsigned_short local_38;
  AmsAddr local_36;
  VirtualConnection *local_28;
  
  DispatcherListGet((AmsConnection *)local_58,connection);
  if ((element_type *)local_58._0_8_ == (element_type *)0x0) {
    __mutex = &connection[0x5b0].second.port;
    std::recursive_mutex::lock((recursive_mutex *)__mutex);
    local_48 = DeleteNotification;
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_38 = in_RDX->first;
    local_36 = in_RDX->second;
    local_28 = connection;
    std::
    make_shared<NotificationDispatcher,std::_Bind<long(AmsConnection::*(AmsConnection*,AmsAddr,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short))(AmsAddr_const&,unsigned_int,unsigned_int,unsigned_short)>>
              ((_Bind<long_(AmsConnection::*(AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short))(const_AmsAddr_&,_unsigned_int,_unsigned_int,_unsigned_short)>
                *)auStack_68);
    pVar1 = std::
            _Rb_tree<std::pair<unsigned_short,AmsAddr>,std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
            ::
            _M_emplace_unique<std::pair<unsigned_short,AmsAddr>const&,std::shared_ptr<NotificationDispatcher>>
                      ((_Rb_tree<std::pair<unsigned_short,AmsAddr>,std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
                        *)(connection + 0x5ac),in_RDX,
                       (shared_ptr<NotificationDispatcher> *)auStack_68);
    std::__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2> *)
               &pVar1.first._M_node._M_node[1]._M_left);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 8));
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    std::__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::DispatcherListAdd(const VirtualConnection& connection)
{
    const auto dispatcher = DispatcherListGet(connection);
    if (dispatcher) {
        return dispatcher;
    }
    std::lock_guard<std::recursive_mutex> lock(dispatcherListMutex);
    return dispatcherList.emplace(connection,
                                  std::make_shared<NotificationDispatcher>(std::bind(&AmsConnection::DeleteNotification,
                                                                                     this,
                                                                                     connection.second,
                                                                                     std::placeholders::_1,
                                                                                     std::placeholders::_2,
                                                                                     connection.first))).first->second;
}